

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteClose(WatWriter *this,NextChar next_char)

{
  NextChar next_char_local;
  WatWriter *this_local;
  
  if (this->next_char_ != ForceNewline) {
    this->next_char_ = None;
  }
  Dedent(this);
  WritePuts(this,")",next_char);
  return;
}

Assistant:

void WatWriter::WriteClose(NextChar next_char) {
  if (next_char_ != NextChar::ForceNewline) {
    next_char_ = NextChar::None;
  }
  Dedent();
  WritePuts(")", next_char);
}